

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O0

void __thiscall deqp::egl::MakeCurrentPerfCase::createWindow(MakeCurrentPerfCase *this)

{
  EGLDisplay pvVar1;
  EGLConfig pvVar2;
  Visibility visibility_;
  int iVar3;
  NativeDisplayFactory *factory;
  CommandLine *pCVar4;
  NativeWindowFactory *pNVar5;
  NativeDisplay *pNVar6;
  TestContext *this_00;
  undefined4 extraout_var;
  WindowParams local_50 [2];
  value_type local_38;
  EGLSurface surface;
  NativeWindow *window;
  NativeWindowFactory *windowFactory;
  EGLint height;
  EGLint width;
  Library *egl;
  MakeCurrentPerfCase *this_local;
  
  egl = (Library *)this;
  _height = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  windowFactory._4_4_ = 0x100;
  windowFactory._0_4_ = 0x100;
  factory = EglTestContext::getNativeDisplayFactory((this->super_TestCase).m_eglTestCtx);
  pCVar4 = tcu::TestContext::getCommandLine
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pNVar5 = eglu::selectNativeWindowFactory(factory,pCVar4);
  surface = (EGLSurface)0x0;
  local_38 = (value_type)0x0;
  window = (NativeWindow *)pNVar5;
  pNVar6 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar1 = this->m_display;
  pvVar2 = this->m_config;
  this_00 = EglTestContext::getTestContext((this->super_TestCase).m_eglTestCtx);
  pCVar4 = tcu::TestContext::getCommandLine(this_00);
  visibility_ = eglu::parseWindowVisibility(pCVar4);
  eglu::WindowParams::WindowParams(local_50,0x100,0x100,visibility_);
  iVar3 = (*(pNVar5->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar5,pNVar6,pvVar1,pvVar2,0,local_50);
  surface = (EGLSurface)CONCAT44(extraout_var,iVar3);
  pNVar6 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  local_38 = eglu::createWindowSurface
                       (pNVar6,(NativeWindow *)surface,this->m_display,this->m_config,
                        (EGLAttrib *)0x0);
  std::vector<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>::push_back
            (&this->m_windows,(value_type *)&surface);
  std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_surfaces,&local_38);
  return;
}

Assistant:

void MakeCurrentPerfCase::createWindow (void)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	const EGLint						width			= 256;
	const EGLint						height			= 256;

	const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

	eglu::NativeWindow*					window			= DE_NULL;
	EGLSurface							surface			= EGL_NO_SURFACE;

	try
	{
		window	= windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_display, m_config, DE_NULL, eglu::WindowParams(width, height, eglu::parseWindowVisibility(m_eglTestCtx.getTestContext().getCommandLine())));
		surface	= eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *window, m_display, m_config, DE_NULL);
	}
	catch (...)
	{
		if (surface != EGL_NO_SURFACE)
			egl.destroySurface(m_display, surface);

		delete window;
		throw;
	}

	m_windows.push_back(window);
	m_surfaces.push_back(surface);
}